

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O2

void __thiscall Sandbox::onFileChange(Sandbox *this,WatchFileList *_files,int index)

{
  pointer pWVar1;
  bool bVar2;
  __type _Var3;
  long lVar4;
  _Base_ptr p_Var5;
  ostream *poVar6;
  FileType FVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  FileType type;
  anon_class_8_1_bc207785 dependency_matches_filename;
  anon_class_24_3_63137608 reset_shaders;
  string filename;
  FileType local_114;
  pointer local_110;
  Sandbox *local_108;
  long local_100;
  anon_class_8_1_bc207785 local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureCube_*>
  local_f0;
  anon_class_24_3_63137608 local_c8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar4 = (long)index;
  pWVar1 = (_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_100 = lVar4 * 0x30;
  FVar7 = pWVar1[lVar4].type;
  local_114 = FVar7;
  std::__cxx11::string::string((string *)&local_b0,(string *)(pWVar1 + lVar4));
  local_f8.filename = &local_b0;
  local_c8.filename = &local_b0;
  local_c8.this = this;
  local_c8._files = _files;
  if (FVar7 == GLSL_DEPENDENCY) {
    bVar2 = onFileChange::anon_class_8_1_bc207785::operator()(&local_f8,&this->m_frag_dependencies);
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)&local_f0,
                 (string *)
                 ((_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
                  super__Vector_impl_data._M_start + this->frag_index));
      local_f0.second._0_4_ = 0;
    }
    else {
      bVar2 = onFileChange::anon_class_8_1_bc207785::operator()
                        (&local_f8,&this->m_vert_dependencies);
      FVar7 = local_114;
      if (!bVar2) goto LAB_001e2d4a;
      std::__cxx11::string::string
                ((string *)&local_f0,
                 (string *)
                 ((_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
                  super__Vector_impl_data._M_start + this->vert_index));
      local_f0.second._0_4_ = 1;
    }
    local_90._M_string_length = (size_type)&local_114;
    local_90._M_dataplus._M_p = (pointer)&local_b0;
    std::tuple<FileType&,std::__cxx11::string&>::operator=
              ((tuple<FileType&,std::__cxx11::string&> *)&local_90,
               (tuple<FileType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    FVar7 = local_114;
  }
LAB_001e2d4a:
  switch(FVar7) {
  case FRAG_SHADER:
    lVar4 = 0x4e0;
    lVar8 = 0x488;
    break;
  case VERT_SHADER:
    lVar4 = 0x4c8;
    lVar8 = 0x4a8;
    break;
  case IMAGE:
    __lhs = &local_50;
    std::__cxx11::string::string((string *)__lhs,(string *)&local_b0);
    local_110 = (_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
                super__Vector_impl_data._M_start;
    local_108 = this;
    for (p_Var5 = *(_Base_ptr *)
                   ((long)&(this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header.
                           _M_header + 0x10);
        (_Rb_tree_header *)p_Var5 !=
        &(this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>
              *)&local_f0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>
              *)(p_Var5 + 1));
      (**(code **)(*(long *)CONCAT44(local_f0.second._4_4_,local_f0.second._0_4_) + 0x58))
                (&local_90);
      _Var3 = std::operator==(__lhs,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_f0);
      if (_Var3) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Reloading");
        __lhs = &local_50;
        poVar6 = std::operator<<(poVar6,(string *)__lhs);
        std::endl<char,std::char_traits<char>>(poVar6);
        (**(code **)(**(long **)(p_Var5 + 2) + 0x20))
                  (*(long **)(p_Var5 + 2),__lhs,(&local_110->vFlip)[local_100],0,0);
        break;
      }
    }
    goto LAB_001e2f4d;
  default:
    goto switchD_001e2d63_caseD_3;
  case CUBEMAP:
    __lhs = &local_70;
    std::__cxx11::string::string((string *)__lhs,(string *)&local_b0);
    local_110 = (_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
                super__Vector_impl_data._M_start;
    local_108 = this;
    for (p_Var5 = *(_Base_ptr *)
                   ((long)&(this->uniforms).super_Scene.cubemaps._M_t._M_impl.super__Rb_tree_header.
                           _M_header + 0x10);
        (_Rb_tree_header *)p_Var5 !=
        &(this->uniforms).super_Scene.cubemaps._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureCube_*>
      ::pair(&local_f0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureCube_*>
              *)(p_Var5 + 1));
      (**(code **)(*(long *)CONCAT44(local_f0.second._4_4_,local_f0.second._0_4_) + 0x58))
                (&local_90);
      _Var3 = std::operator==(__lhs,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_f0);
      if (_Var3) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Reloading");
        __lhs = &local_70;
        poVar6 = std::operator<<(poVar6,(string *)__lhs);
        std::endl<char,std::char_traits<char>>(poVar6);
        (**(code **)(**(long **)(p_Var5 + 2) + 0x88))
                  (*(long **)(p_Var5 + 2),__lhs,(&local_110->vFlip)[local_100]);
        break;
      }
    }
LAB_001e2f4d:
    std::__cxx11::string::~string((string *)__lhs);
    this = local_108;
    goto switchD_001e2d63_caseD_3;
  }
  onFileChange::anon_class_24_3_63137608::operator()
            (&local_c8,(string *)((long)&this->_vptr_Sandbox + lVar8),
             (StringList *)((long)&this->_vptr_Sandbox + lVar4));
switchD_001e2d63_caseD_3:
  this->m_change = true;
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void Sandbox::onFileChange(WatchFileList &_files, int index) {
    FileType type = _files[index].type;
    std::string filename = _files[index].path;

    const auto reset_shaders = [&](std::string& source, vera::StringList& dependencies){
        source = "";
        dependencies.clear();
        if ( vera::loadGlslFrom(filename, &source, include_folders, &dependencies) )
            resetShaders(_files);
    };

    const auto dependency_matches_filename = [&](const vera::StringList& dependencies) {
        return std::any_of(std::begin(dependencies), std::end(dependencies), [&](const std::string& dependency){ return dependency == filename; });
    };

    // IF the change is on a dependency file, re route to the correct shader that need to be reload
    if (type == GLSL_DEPENDENCY) {
        using kv = std::tuple<FileType, std::string>;
        if (dependency_matches_filename(m_frag_dependencies)){
            std::tie(type, filename) = kv{FRAG_SHADER, _files[frag_index].path};
        } else if (dependency_matches_filename(m_vert_dependencies)){
            std::tie(type, filename) = kv{VERT_SHADER, _files[vert_index].path};
        }
    }
    switch(type) {
    case FRAG_SHADER:
        reset_shaders(m_frag_source, m_frag_dependencies);
        break;
    case VERT_SHADER:
        reset_shaders(m_vert_source, m_vert_dependencies);
        break;
    case GEOMETRY:
        // TODO
        break;
    case IMAGE:
        reload_uniforms(uniforms.textures, filename, _files[index]);
        break;
    case CUBEMAP:
        reload_uniforms(uniforms.cubemaps, filename, _files[index]);
        break;
    default: //'GLSL_DEPENDENCY' and 'IMAGE_BUMPMAP' not handled in switch
        break;
    }
    flagChange();
}